

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,BlockVariable *var)

{
  char cVar1;
  QTextStream *pQVar2;
  Data *pDVar3;
  Stream *__old_val;
  char *pcVar4;
  long lVar5;
  Latin1Content LVar6;
  long in_RDX;
  char *pcVar7;
  undefined8 *puVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QDebugStateSaver saver;
  QDebug local_78;
  QtPrivate local_70 [8];
  QDebug local_68;
  QtPrivate local_60 [8];
  undefined1 *local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)var);
  pQVar2 = (QTextStream *)(var->name).d.d;
  pQVar2[0x30] = (QTextStream)0x0;
  QVar9.m_data = (storage_type *)0xe;
  QVar9.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar2,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(var->name).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  LVar6 = ContainsBinary;
  lVar5 = 0;
  do {
    if (*(int *)(typeTab[0].k + lVar5 + 0x14) == *(int *)(in_RDX + 0x18)) {
      pcVar7 = typeTab[0].k + lVar5;
      LVar6 = ~ContainsBinary;
      pcVar4 = pcVar7;
      do {
        LVar6 = LVar6 + ContainsLatin1;
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\0');
      goto LAB_004724de;
    }
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x678);
  pcVar7 = (char *)0x0;
LAB_004724de:
  QDebug::putByteArray((char *)var,(ulong)pcVar7,LVar6);
  pQVar2 = (QTextStream *)(var->name).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  QTextStream::operator<<((QTextStream *)(var->name).d.d,' ');
  pQVar2 = (QTextStream *)(var->name).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  puVar8 = *(undefined8 **)(in_RDX + 8);
  if (puVar8 == (undefined8 *)0x0) {
    puVar8 = &QByteArray::_empty;
  }
  QDebug::putByteArray((char *)var,(ulong)puVar8,(Latin1Content)*(undefined8 *)(in_RDX + 0x10));
  pQVar2 = (QTextStream *)(var->name).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  if (*(int *)(in_RDX + 0x1c) != -1) {
    pQVar2 = (QTextStream *)(var->name).d.d;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar10.m_data = (storage_type *)0x8;
    QVar10.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<(pQVar2,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (QTextStream *)(var->name).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
    QTextStream::operator<<((QTextStream *)(var->name).d.d,*(int *)(in_RDX + 0x1c));
    pQVar2 = (QTextStream *)(var->name).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
  }
  pQVar2 = (QTextStream *)(var->name).d.d;
  pQVar2[0x30] = (QTextStream)0x0;
  QVar11.m_data = &DAT_00000006;
  QVar11.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar11);
  QTextStream::operator<<(pQVar2,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(var->name).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  QTextStream::operator<<((QTextStream *)(var->name).d.d,*(int *)(in_RDX + 0x20));
  pQVar2 = (QTextStream *)(var->name).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  if (*(long *)(in_RDX + 0x38) != 0) {
    pQVar2 = (QTextStream *)(var->name).d.d;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar12.m_data = (storage_type *)0x7;
    QVar12.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<(pQVar2,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (QTextStream *)(var->name).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
    local_50.d.d = (Data *)(var->name).d.d;
    *(int *)&((QArrayData *)local_50.d.d)[2].alloc = (int)((QArrayData *)local_50.d.d)[2].alloc + 1;
    local_68.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<int>>
              (local_60,(Stream *)&local_50,"QList",(QList<int> *)(in_RDX + 0x28));
    QDebug::~QDebug((QDebug *)&local_50);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug(&local_68);
  }
  if (*(int *)(in_RDX + 0x40) != 0) {
    pQVar2 = (QTextStream *)(var->name).d.d;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar13.m_data = (storage_type *)0xd;
    QVar13.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<(pQVar2,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (QTextStream *)(var->name).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
    QTextStream::operator<<((QTextStream *)(var->name).d.d,*(int *)(in_RDX + 0x40));
    pQVar2 = (QTextStream *)(var->name).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
  }
  if (*(int *)(in_RDX + 0x44) != 0) {
    pQVar2 = (QTextStream *)(var->name).d.d;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar14.m_data = (storage_type *)0xe;
    QVar14.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<(pQVar2,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (QTextStream *)(var->name).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
    QTextStream::operator<<((QTextStream *)(var->name).d.d,*(int *)(in_RDX + 0x44));
    pQVar2 = (QTextStream *)(var->name).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
  }
  if (*(char *)(in_RDX + 0x48) == '\x01') {
    pQVar2 = (QTextStream *)(var->name).d.d;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar15.m_data = (storage_type *)0x9;
    QVar15.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar15);
    QTextStream::operator<<(pQVar2,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (QTextStream *)(var->name).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
  }
  if (*(long *)(in_RDX + 0x60) != 0) {
    pQVar2 = (QTextStream *)(var->name).d.d;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar16.m_data = (storage_type *)0xf;
    QVar16.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar16);
    QTextStream::operator<<(pQVar2,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (QTextStream *)(var->name).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
    local_50.d.d = (Data *)(var->name).d.d;
    *(int *)&((QArrayData *)local_50.d.d)[2].alloc = (int)((QArrayData *)local_50.d.d)[2].alloc + 1;
    local_78.stream = (Stream *)0x0;
    QtPrivate::printSequentialContainer<QList<QShaderDescription::BlockVariable>>
              (local_70,(Stream *)&local_50,"QList",
               (QList<QShaderDescription::BlockVariable> *)(in_RDX + 0x50));
    QDebug::~QDebug((QDebug *)&local_50);
    QDebug::~QDebug((QDebug *)local_70);
    QDebug::~QDebug(&local_78);
  }
  pQVar2 = (QTextStream *)(var->name).d.d;
  pQVar2[0x30] = (QTextStream)0x0;
  QTextStream::operator<<(pQVar2,')');
  pQVar2 = (QTextStream *)(var->name).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  pDVar3 = (var->name).d.d;
  (var->name).d.d = (Data *)0x0;
  *(Data **)dbg.stream = pDVar3;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QShaderDescription::BlockVariable &var)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "BlockVariable(" << typeStr(var.type) << ' ' << var.name;
    if (var.offset != -1)
        dbg.nospace() << " offset=" << var.offset;
    dbg.nospace() << " size=" << var.size;
    if (!var.arrayDims.isEmpty())
        dbg.nospace() << " array=" << var.arrayDims;
    if (var.arrayStride)
        dbg.nospace() << " arrayStride=" << var.arrayStride;
    if (var.matrixStride)
        dbg.nospace() << " matrixStride=" << var.matrixStride;
    if (var.matrixIsRowMajor)
        dbg.nospace() << " [rowmaj]";
    if (!var.structMembers.isEmpty())
        dbg.nospace() << " structMembers=" << var.structMembers;
    dbg.nospace() << ')';
    return dbg;
}